

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O0

void ror_6A(void)

{
  ubyte uVar1;
  ubyte oldcar;
  
  uVar1 = carry_f;
  except = '\0';
  carry_f = acc & 1;
  acc = (ubyte)((int)(uint)acc >> 1);
  if (uVar1 != '\0') {
    acc = acc | 0x80;
  }
  result_f = acc;
  return;
}

Assistant:

void ror_6A(void) {
    ubyte oldcar;

    CLE;
    oldcar = carry_f;


    carry_f = acc & 1;
    acc >>= 1;

    if (oldcar) acc |= 0x80;
    result_f = acc;
}